

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

size_t __thiscall
kj::_::Delimited<kj::ArrayPtr<const_kj::StringPtr>_>::size
          (Delimited<kj::ArrayPtr<const_kj::StringPtr>_> *this)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  ensureStringifiedInitialized(this);
  sVar1 = (this->stringified).size_;
  if (sVar1 == 0) {
    sVar2 = 0;
  }
  else {
    lVar3 = 1;
    lVar4 = 0;
    sVar2 = 0;
    do {
      lVar5 = (this->delimiter).content.size_ - 1;
      if (lVar3 != 0) {
        lVar5 = 0;
        lVar3 = 0;
      }
      sVar2 = sVar2 + *(long *)((long)&((this->stringified).ptr)->size_ + lVar4) + lVar5;
      lVar4 = lVar4 + 0x10;
    } while (sVar1 << 4 != lVar4);
  }
  return sVar2;
}

Assistant:

size_t size() {
    ensureStringifiedInitialized();

    size_t result = 0;
    bool first = true;
    for (auto& e: stringified) {
      if (first) {
        first = false;
      } else {
        result += delimiter.size();
      }
      result += e.size();
    }
    return result;
  }